

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPExternalTransmitter::SendRTPData(RTPExternalTransmitter *this,void *data,size_t len)

{
  char cVar1;
  int iVar2;
  
  iVar2 = -0x97;
  if (((this->init == true) && (iVar2 = -0x96, this->created == true)) &&
     (iVar2 = -0x9a, len <= this->maxpacksize)) {
    if (this->sender == (RTPExternalSender *)0x0) {
      return -0x95;
    }
    cVar1 = (**(code **)(*(long *)this->sender + 0x10))();
    iVar2 = -0x99;
    if (cVar1 != '\0') {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int RTPExternalTransmitter::SendRTPData(const void *data,size_t len)	
{
	if (!init)
		return ERR_RTP_EXTERNALTRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOTCREATED;
	}
	if (len > maxpacksize)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_SPECIFIEDSIZETOOBIG;
	}
	
	if (!sender)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOSENDER;
	}

	MAINMUTEX_UNLOCK

	if (!sender->SendRTP(data, len))
		return ERR_RTP_EXTERNALTRANS_SENDERROR;

	return 0;
}